

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

NodeData * __thiscall c4::yml::Parser::_append_key_val(Parser *this,csubstr val,flag_t val_quoted)

{
  Tree *pTVar1;
  size_t node;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  csubstr val_00;
  bool bVar6;
  NodeData *pNVar7;
  ulong uVar8;
  size_t ichild;
  type_bits more_flags;
  csubstr cVar9;
  csubstr key;
  csubstr tag;
  csubstr tag_00;
  char msg [49];
  char local_b8 [24];
  char *pcStack_a0;
  char local_98 [32];
  size_t local_78;
  char *local_70;
  char *local_68;
  size_t local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_60 = val.len;
  local_68 = val.str;
  pTVar1 = this->m_tree;
  uVar8 = this->m_state->node_id;
  if ((uVar8 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar8)) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = -0x7a;
    local_b8[9] = 'K';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98[0] = 'e';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[uVar8].m_type.type & MAP) == NOTYPE) {
    builtin_strncpy(local_98,"state->node_id))",0x11);
    builtin_strncpy(local_b8 + 0x10,"_tree->i",8);
    pcStack_a0 = (char *)0x5f6d2870616d5f73;
    builtin_strncpy(local_b8,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    local_58 = 0;
    uStack_50 = 0x790a;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x790a) << 0x40);
    LVar4.name.str._0_4_ = 0x1fdf9a;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_b8,0x31,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar8 = (ulong)((this->m_state->flags & 0x400U) << 3);
  more_flags = uVar8 + 0x1000;
  if (val_quoted == 0) {
    more_flags = uVar8;
  }
  cVar9 = _consume_scalar(this);
  local_78 = cVar9.len;
  local_70 = cVar9.str;
  pTVar1 = this->m_tree;
  node = this->m_state->node_id;
  if ((node == 0xffffffffffffffff) || (pTVar1->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      cVar9.len = local_78;
      cVar9.str = local_70;
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    local_78 = cVar9.len;
    local_70 = cVar9.str;
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = -0x7d;
    local_b8[9] = 'K';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98[0] = 'e';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    cVar9.len = local_78;
    cVar9.str = local_70;
  }
  local_78 = cVar9.len;
  local_70 = cVar9.str;
  uVar8 = pTVar1->m_buf[node].m_last_child;
  if (node == 0xffffffffffffffff) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      cVar9.len = local_78;
      cVar9.str = local_70;
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    local_78 = cVar9.len;
    local_70 = cVar9.str;
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = -0x4f;
    local_b8[9] = 'L';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98[0] = 'e';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    cVar9.len = local_78;
    cVar9.str = local_70;
  }
  local_78 = cVar9.len;
  local_70 = cVar9.str;
  if ((node == 0xffffffffffffffff) || (pTVar1->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      cVar9.len = local_78;
      cVar9.str = local_70;
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    local_78 = cVar9.len;
    local_70 = cVar9.str;
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = -0x7a;
    local_b8[9] = 'K';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98[0] = 'e';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    cVar9.len = local_78;
    cVar9.str = local_70;
  }
  local_78 = cVar9.len;
  local_70 = cVar9.str;
  if ((pTVar1->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    bVar6 = Tree::is_root(pTVar1,node);
    cVar9.len = local_78;
    cVar9.str = local_70;
    if (!bVar6) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar3 = (code *)swi(3);
          pNVar7 = (NodeData *)(*pcVar3)();
          return pNVar7;
        }
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = -0x4e;
      local_b8[9] = 'L';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98[0] = 'e';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
      cVar9.len = local_78;
      cVar9.str = local_70;
    }
  }
  local_78 = cVar9.len;
  local_70 = cVar9.str;
  if (uVar8 != 0xffffffffffffffff) {
    if (pTVar1->m_cap <= uVar8) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        cVar9.len = local_78;
        cVar9.str = local_70;
        if (bVar6) {
          pcVar3 = (code *)swi(3);
          pNVar7 = (NodeData *)(*pcVar3)();
          return pNVar7;
        }
      }
      local_78 = cVar9.len;
      local_70 = cVar9.str;
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = -0x7d;
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98[0] = 'e';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      cVar9.len = local_78;
      cVar9.str = local_70;
    }
    local_78 = cVar9.len;
    local_70 = cVar9.str;
    if (pTVar1->m_buf[uVar8].m_parent != node) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        cVar9.len = local_78;
        cVar9.str = local_70;
        if (bVar6) {
          pcVar3 = (code *)swi(3);
          pNVar7 = (NodeData *)(*pcVar3)();
          return pNVar7;
        }
      }
      local_78 = cVar9.len;
      local_70 = cVar9.str;
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = -0x4d;
      local_b8[9] = 'L';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98[0] = 'e';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
      cVar9.len = local_78;
      cVar9.str = local_70;
    }
  }
  local_78 = cVar9.len;
  local_70 = cVar9.str;
  ichild = Tree::_claim(pTVar1);
  Tree::_set_hierarchy(pTVar1,ichild,node,uVar8);
  val_00.len = local_60;
  val_00.str = local_68;
  key.len = local_78;
  key.str = local_70;
  Tree::to_keyval(this->m_tree,ichild,key,val_00,more_flags);
  pcVar2 = (this->m_key_tag).str;
  if (pcVar2 != (char *)0x0 && (this->m_key_tag).len != 0) {
    pTVar1 = this->m_tree;
    tag.len = (this->m_key_tag).len;
    tag.str = pcVar2;
    cVar9 = normalize_tag(tag);
    Tree::set_key_tag(pTVar1,ichild,cVar9);
    (this->m_key_tag).str = (char *)0x0;
    (this->m_key_tag).len = 0;
  }
  pcVar2 = (this->m_val_tag).str;
  if (pcVar2 != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar1 = this->m_tree;
    tag_00.len = (this->m_val_tag).len;
    tag_00.str = pcVar2;
    cVar9 = normalize_tag(tag_00);
    Tree::set_val_tag(pTVar1,ichild,cVar9);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  _write_key_anchor(this,ichild);
  _write_val_anchor(this,ichild);
  this->m_state->flags = this->m_state->flags & 0xffffffdf;
  if (ichild == 0xffffffffffffffff) {
    pNVar7 = (NodeData *)0x0;
  }
  else {
    pTVar1 = this->m_tree;
    if (pTVar1->m_cap <= ichild) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar3 = (code *)swi(3);
          pNVar7 = (NodeData *)(*pcVar3)();
          return pNVar7;
        }
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = 't';
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98[0] = 'e';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar7 = pTVar1->m_buf + ichild;
  }
  return pNVar7;
}

Assistant:

NodeData* Parser::_append_key_val(csubstr val, flag_t val_quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(m_state->node_id));
    type_bits additional_flags = 0;
    if(m_state->flags & QSCL)
        additional_flags |= KEYQUO;
    if(val_quoted)
        additional_flags |= VALQUO;

    csubstr key = _consume_scalar();
    _c4dbgpf("append keyval: '{}' '{}' to parent id={} (level={}){}{}", key, val, m_state->node_id, m_state->level, (additional_flags & KEYQUO) ? " KEYQUO!" : "", (additional_flags & VALQUO) ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_keyval(nid, key, val, additional_flags);
    _c4dbgpf("append keyval: id={} key='{}' val='{}'", nid, m_tree->key(nid), m_tree->val(nid));
    if( ! m_key_tag.empty())
    {
        _c4dbgpf("append keyval[{}]: set key tag='{}' -> '{}'", nid, m_key_tag, normalize_tag(m_key_tag));
        m_tree->set_key_tag(nid, normalize_tag(m_key_tag));
        m_key_tag.clear();
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append keyval[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_key_anchor(nid);
    _write_val_anchor(nid);
    rem_flags(QMRK);
    return m_tree->get(nid);
}